

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O0

string * extract_module_name_abi_cxx11_(char *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_RDI;
  size_type pos;
  string module_name;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_31;
  string local_30 [48];
  
  __a = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),__a);
  std::allocator<char>::~allocator(&local_31);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::string::rfind((char *)local_30,0x110934);
  if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  }
  else {
    std::__cxx11::string::erase((ulong)local_30,(ulong)this);
    std::__cxx11::string::string((string *)in_RDI,local_30);
  }
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string extract_module_name(const char* name) {
    string module_name = name;
    string::size_type pos = module_name.rfind("::");

    if ( pos == string::npos )
        return string(GLOBAL_MODULE_NAME);

    module_name.erase(pos);

    return module_name;
}